

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_exception_primitive_onDo
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  int iVar1;
  undefined1 local_168 [8];
  sysbvm_stackFrameLandingPadRecord_t landingPadRecord;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_8_1_6971b95b gcFrame;
  sysbvm_tuple_t *exceptionAction;
  sysbvm_tuple_t *exceptionType;
  sysbvm_tuple_t *body;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 3) {
    sysbvm_error_argumentCountMismatch(3,argumentCount);
  }
  memset(&gcFrameRecord.roots,0,8);
  memset(landingPadRecord.jmpbuffer[0].__saved_mask.__val + 0xf,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_FUNCTION_ACTIVATION;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord
            ((sysbvm_stackFrameRecord_t *)(landingPadRecord.jmpbuffer[0].__saved_mask.__val + 0xf));
  memset(local_168,0,0x100);
  landingPadRecord.previous._0_4_ = 7;
  landingPadRecord._8_8_ = arguments[1];
  landingPadRecord.exception = arguments[2];
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)local_168);
  iVar1 = _setjmp((__jmp_buf_tag *)&landingPadRecord.actionResult);
  if (iVar1 == 0) {
    gcFrameRecord.roots = (sysbvm_tuple_t *)sysbvm_function_apply0(context,*arguments);
  }
  else {
    gcFrameRecord.roots = (sysbvm_tuple_t *)landingPadRecord.action;
  }
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)local_168);
  sysbvm_stackFrame_popRecord
            ((sysbvm_stackFrameRecord_t *)(landingPadRecord.jmpbuffer[0].__saved_mask.__val + 0xf));
  return (sysbvm_tuple_t)gcFrameRecord.roots;
}

Assistant:

static sysbvm_tuple_t sysbvm_exception_primitive_onDo(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 3) sysbvm_error_argumentCountMismatch(3, argumentCount);

    sysbvm_tuple_t *body = arguments + 0;
    sysbvm_tuple_t *exceptionType = arguments + 1;
    sysbvm_tuple_t *exceptionAction = arguments + 2;

    struct {
        sysbvm_tuple_t result;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    sysbvm_stackFrameLandingPadRecord_t landingPadRecord = {
        .type = SYSBVM_STACK_FRAME_RECORD_TYPE_LANDING_PAD,
        .exceptionFilter = *exceptionType,
        .action = *exceptionAction
    };
    sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t*)&landingPadRecord);

    if(!_setjmp(landingPadRecord.jmpbuffer))
        gcFrame.result = sysbvm_function_apply0(context, *body);
    else
        gcFrame.result = landingPadRecord.actionResult;

    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t*)&landingPadRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}